

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_singlestep_exception(DisasContext_conflict1 *s)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGTemp *ts;
  TCGContext_conflict1 *tcg_ctx;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if (s->ss_active == true) {
    s->pstate_ss = false;
    ts = tcg_temp_new_internal_aarch64(tcg_ctx_00,TCG_TYPE_I32,false);
    tcg_gen_op3_aarch64(tcg_ctx_00,INDEX_op_ld_i32,(TCGArg)ts,
                        (TCGArg)(tcg_ctx_00->cpu_env + (long)tcg_ctx_00),0x148);
    tcg_gen_andi_i32_aarch64
              (tcg_ctx_00,(TCGv_i32)((long)ts - (long)tcg_ctx_00),
               (TCGv_i32)((long)ts - (long)tcg_ctx_00),-0x200001);
    tcg_gen_op3_aarch64(tcg_ctx_00,INDEX_op_st_i32,(TCGArg)ts,
                        (TCGArg)(tcg_ctx_00->cpu_env + (long)tcg_ctx_00),0x148);
    tcg_temp_free_internal_aarch64(tcg_ctx_00,ts);
    gen_swstep_exception(s,1,(uint)s->is_ldex);
    (s->base).is_jmp = DISAS_NORETURN;
    return;
  }
  gen_exception_internal(tcg_ctx_00,0x10002);
  return;
}

Assistant:

static void gen_singlestep_exception(DisasContext *s)
{
    /* Generate the right kind of exception for singlestep, which is
     * either the architectural singlestep or EXCP_DEBUG for QEMU's
     * gdb singlestepping.
     */
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (s->ss_active) {
        gen_step_complete_exception(s);
    } else {
        gen_exception_internal(tcg_ctx, EXCP_DEBUG);
    }
}